

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O0

int Abc_SclGetRealFaninLit(Abc_Obj_t *pObj)

{
  int iVar1;
  uint Var;
  int c;
  Abc_Obj_t *pObj_00;
  int iLit;
  Abc_Obj_t *pObj_local;
  
  iVar1 = Abc_SclObjIsBufInv(pObj);
  if (iVar1 == 0) {
    Var = Abc_ObjId(pObj);
    pObj_local._4_4_ = Abc_Var2Lit(Var,0);
  }
  else {
    pObj_00 = Abc_ObjFanin0(pObj);
    iVar1 = Abc_SclGetRealFaninLit(pObj_00);
    c = Abc_SclIsInv(pObj);
    pObj_local._4_4_ = Abc_LitNotCond(iVar1,c);
  }
  return pObj_local._4_4_;
}

Assistant:

int Abc_SclGetRealFaninLit( Abc_Obj_t * pObj )
{
    int iLit;
    if ( !Abc_SclObjIsBufInv(pObj) )
        return Abc_Var2Lit( Abc_ObjId(pObj), 0 );
    iLit = Abc_SclGetRealFaninLit( Abc_ObjFanin0(pObj) );
    return Abc_LitNotCond( iLit, Abc_SclIsInv(pObj) );
}